

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FreeTypeFaceWrapper.cpp
# Opt level: O0

EFontStretch __thiscall FreeTypeFaceWrapper::StretchFromName(FreeTypeFaceWrapper *this)

{
  char *pcVar1;
  FreeTypeFaceWrapper *this_local;
  
  if (this->mFace == (FT_Face)0x0) {
    this_local._4_4_ = eFontStretchUknown;
  }
  else if (this->mFace->style_name == (FT_String *)0x0) {
    this_local._4_4_ = eFontStretchNormal;
  }
  else {
    pcVar1 = strstr(this->mFace->style_name,"Semi Condensed");
    if (pcVar1 == (char *)0x0) {
      pcVar1 = strstr(this->mFace->style_name,"Ultra Condensed");
      if (((pcVar1 == (char *)0x0) &&
          (pcVar1 = strstr(this->mFace->style_name,"Extra Compressed"), pcVar1 == (char *)0x0)) &&
         (pcVar1 = strstr(this->mFace->style_name,"Ultra Compressed"), pcVar1 == (char *)0x0)) {
        pcVar1 = strstr(this->mFace->style_name,"Extra Condensed");
        if ((pcVar1 != (char *)0x0) ||
           (pcVar1 = strstr(this->mFace->style_name,"Compressed"), pcVar1 != (char *)0x0)) {
          return eFontStretchExtraCondensed;
        }
        pcVar1 = strstr(this->mFace->style_name,"Condensed");
        if (pcVar1 != (char *)0x0) {
          return eFontStretchCondensed;
        }
        pcVar1 = strstr(this->mFace->style_name,"Semi Expanded");
        if (pcVar1 != (char *)0x0) {
          return eFontStretchSemiExpanded;
        }
        pcVar1 = strstr(this->mFace->style_name,"Extra Expanded");
        if (pcVar1 != (char *)0x0) {
          return eFontStretchExtraExpanded;
        }
        pcVar1 = strstr(this->mFace->style_name,"Ultra Expanded");
        if (pcVar1 != (char *)0x0) {
          return eFontStretchUltraExpanded;
        }
        pcVar1 = strstr(this->mFace->style_name,"Expanded");
        if (pcVar1 != (char *)0x0) {
          return eFontStretchExpanded;
        }
        return eFontStretchNormal;
      }
      this_local._4_4_ = eFontStretchUltraCondensed;
    }
    else {
      this_local._4_4_ = eFontStretchSemiCondensed;
    }
  }
  return this_local._4_4_;
}

Assistant:

EFontStretch FreeTypeFaceWrapper::StretchFromName()
{
	if(mFace)
	{
		if(mFace->style_name)
		{
			if(strstr(mFace->style_name,"Semi Condensed") != NULL)
				return eFontStretchSemiCondensed;

			if(strstr(mFace->style_name,"Ultra Condensed") != NULL || strstr(mFace->style_name,"Extra Compressed") != NULL || strstr(mFace->style_name,"Ultra Compressed") != NULL)
				return eFontStretchUltraCondensed;

			if(strstr(mFace->style_name,"Extra Condensed") != NULL || strstr(mFace->style_name,"Compressed") != NULL)
				return eFontStretchExtraCondensed;

			if(strstr(mFace->style_name,"Condensed") != NULL)
				return eFontStretchCondensed;

			if(strstr(mFace->style_name,"Semi Expanded") != NULL)
				return eFontStretchSemiExpanded;

			if(strstr(mFace->style_name,"Extra Expanded") != NULL)
				return eFontStretchExtraExpanded;

			if(strstr(mFace->style_name,"Ultra Expanded") != NULL)
				return eFontStretchUltraExpanded;

			if(strstr(mFace->style_name,"Expanded") != NULL)
				return eFontStretchExpanded;

			return eFontStretchNormal;
		}
		else
			return eFontStretchNormal;
	}
	else
		return eFontStretchUknown;
}